

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O1

any * __thiscall dap::any::operator=(any *this,any *rhs)

{
  TypeInfo *pTVar1;
  int iVar2;
  int iVar3;
  uintptr_t addr;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar5;
  uint8_t *puVar6;
  ulong uVar7;
  ulong uVar4;
  
  if (this->value != (void *)0x0) {
    (*this->type->_vptr_TypeInfo[7])();
    if (this->value == (void *)0x0) {
      __assert_fail("value != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xc3,"void dap::any::free()");
    }
    if (this->heap != (void *)0x0) {
      operator_delete__(this->heap);
      this->heap = (void *)0x0;
    }
    this->value = (void *)0x0;
  }
  this->value = (void *)0x0;
  this->type = (TypeInfo *)0x0;
  pTVar1 = rhs->type;
  this->type = pTVar1;
  if (rhs->value != (void *)0x0) {
    iVar2 = (*pTVar1->_vptr_TypeInfo[3])();
    iVar3 = (*this->type->_vptr_TypeInfo[4])();
    uVar4 = CONCAT44(extraout_var_00,iVar3);
    if (this->value != (void *)0x0) {
      __assert_fail("value == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/any.h"
                    ,0xb9,"void dap::any::alloc(size_t, size_t)");
    }
    puVar6 = this->buffer + (uVar4 - 1);
    puVar6 = puVar6 + -((ulong)puVar6 % uVar4);
    this->value = puVar6;
    if ((any *)(puVar6 + CONCAT44(extraout_var,iVar2) + -1) < this->buffer ||
        this + 1 <= (any *)(puVar6 + CONCAT44(extraout_var,iVar2) + -1)) {
      pvVar5 = operator_new__(CONCAT44(extraout_var,iVar2) + uVar4);
      this->heap = pvVar5;
      uVar7 = (uVar4 - 1) + (long)pvVar5;
      this->value = (void *)(uVar7 - uVar7 % uVar4);
    }
    (*this->type->_vptr_TypeInfo[6])(this->type,this->value,rhs->value);
  }
  return this;
}

Assistant:

any& any::operator=(const any& rhs) {
  reset();
  type = rhs.type;
  if (rhs.value != nullptr) {
    alloc(type->size(), type->alignment());
    type->copyConstruct(value, rhs.value);
  }
  return *this;
}